

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix-qdf.cc
# Opt level: O0

void __thiscall QdfFixer::processLines(QdfFixer *this,string *input)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  basic_string_view<char,_std::char_traits<char>_> __str_04;
  bool bVar1;
  int iVar2;
  char *__str_05;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  qpdf_offset_t qVar6;
  ostream *poVar7;
  size_t sVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  string local_430 [32];
  reference local_410;
  QPDFXRefEntry *e_1;
  iterator __end13;
  iterator __begin13;
  vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_> *__range13;
  size_type n;
  size_type local_3e0;
  string local_3d8;
  undefined1 local_3b8 [8];
  string new_length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  char *local_318;
  size_t sStack_310;
  string_type local_308;
  basic_string_view<char,_std::char_traits<char>_> local_2e8;
  char *local_2d8;
  size_t sStack_2d0;
  long local_2c8;
  basic_string_view<char,_std::char_traits<char>_> local_2c0;
  int local_2b0;
  int local_2ac;
  longlong local_2a8;
  int local_2a0;
  uint local_29c;
  unsigned_long_long uStack_298;
  uint type;
  unsigned_long_long f2;
  unsigned_long_long f1;
  QPDFXRefEntry *x;
  iterator __end10;
  iterator __begin10;
  vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_> *__range10;
  size_type size;
  long local_208;
  basic_string_view<char,_std::char_traits<char>_> local_200;
  string_type local_1f0;
  long local_1d0;
  string_type local_1c8;
  string_type local_1a8;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  ulong local_178;
  size_t length;
  size_t esize;
  QPDFXRefEntry *e;
  iterator __end8;
  iterator __begin8;
  vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_> *__range8;
  qpdf_offset_t qStack_140;
  int max_objects;
  qpdf_offset_t t;
  string_type local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  undefined1 local_98 [8];
  anon_class_24_3_b7c57803 matches;
  smatch m;
  const_iterator b_line;
  size_t offs;
  string_view input_view;
  string_view line;
  difference_type len_line;
  bool more;
  anon_class_1_0_00000001 sv_diff;
  string *input_local;
  QdfFixer *this_local;
  
  if ((processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_)
     , iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_,"^(\\d+) 0 obj\n$",
               0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_);
  }
  if ((processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_)
     , iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_,
               "/Extends (\\d+ 0 R)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_);
  }
  if ((processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::
                                   re_ostream_obj_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_,
               "^%% Object stream: object (\\d+)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_);
  }
  if ((processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_),
     iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_,"^\\d+\n$",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_);
  }
  if ((processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_),
     iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_,"^  /Size \\d+\n$",
               0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_);
  }
  this->lineno = 0;
  len_line._2_1_ = 1;
  line._M_str = (char *)processLines::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)((long)&len_line + 3),0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str);
  __str_05 = (char *)std::__cxx11::string::data();
  sVar3 = std::__cxx11::string::size();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&offs,__str_05,sVar3);
  m._M_begin._M_current = (char *)std::__cxx11::string::cbegin();
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&matches.len_line);
  local_98 = (undefined1  [8])&matches.len_line;
  matches.m = (smatch *)&m._M_begin;
  matches.b_line = (const_iterator *)&line._M_str;
  while ((len_line._2_1_ & 1) != 0) {
    this->lineno = this->lineno + 1;
    this->last_offset = this->offset;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator+=(&m._M_begin,(difference_type)line._M_str);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)&offs,'\n',0);
    if (sVar4 == 0xffffffffffffffff) {
      len_line._2_1_ = 0;
      input_view._M_str = (char *)offs;
      line._M_len = input_view._M_len;
    }
    else {
      bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&offs,0,sVar4 + 1);
      line._M_len = (size_t)bVar9._M_str;
      input_view._M_str = (char *)bVar9._M_len;
      local_a8 = bVar9;
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&offs,sVar4 + 1);
    }
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str);
    line._M_str = (char *)processLines::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)((long)&len_line + 3),sVar3);
    this->offset = (qpdf_offset_t)(line._M_str + this->offset);
    if (this->state == st_top) {
      bVar1 = processLines::anon_class_24_3_b7c57803::operator()
                        ((anon_class_24_3_b7c57803 *)local_98,
                         &processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_);
      if (bVar1) {
        pvVar5 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&matches.len_line,1);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str(&local_c8,pvVar5);
        checkObjId(this,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        this->state = st_in_obj;
      }
      else {
        bVar9 = sv("xref\n",5);
        iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str,
                           bVar9);
        if (iVar2 == 0) {
          this->xref_offset = this->last_offset;
          this->state = st_at_xref;
        }
      }
      __str_04._M_str = (char *)line._M_len;
      __str_04._M_len = (size_t)input_view._M_str;
      std::operator<<(this->out,__str_04);
    }
    else if (this->state == st_in_obj) {
      __str_03._M_str = (char *)line._M_len;
      __str_03._M_len = (size_t)input_view._M_str;
      std::operator<<(this->out,__str_03);
      bVar9 = sv("stream\n",7);
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str,
                         bVar9);
      if (iVar2 == 0) {
        this->state = st_in_stream;
        this->stream_start = this->offset;
      }
      else {
        bVar9 = sv("endobj\n",7);
        iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str,
                           bVar9);
        if (iVar2 == 0) {
          this->state = st_top;
        }
        else {
          bVar9 = sv("/Type /ObjStm",0xd);
          sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str,
                             bVar9,0);
          if (sVar4 == 0xffffffffffffffff) {
            bVar9 = sv("/Type /XRef",0xb);
            sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               &input_view._M_str,bVar9,0);
            if (sVar4 != 0xffffffffffffffff) {
              std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>::back(&this->xref);
              qVar6 = QPDFXRefEntry::getOffset();
              this->xref_offset = qVar6;
              this->xref_f1_nbytes = 0;
              qStack_140 = this->xref_offset;
              while (qStack_140 != 0) {
                qStack_140 = qStack_140 >> 8;
                this->xref_f1_nbytes = this->xref_f1_nbytes + 1;
              }
              __range8._4_4_ = 1;
              __end8 = std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>::begin
                                 (&this->xref);
              e = (QPDFXRefEntry *)
                  std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>::end(&this->xref);
              while( true ) {
                bVar1 = __gnu_cxx::operator!=
                                  (&__end8,(__normal_iterator<QPDFXRefEntry_*,_std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>_>
                                            *)&e);
                if (!bVar1) break;
                esize = (size_t)__gnu_cxx::
                                __normal_iterator<QPDFXRefEntry_*,_std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>_>
                                ::operator*(&__end8);
                iVar2 = QPDFXRefEntry::getType();
                if (iVar2 == 2) {
                  iVar2 = QPDFXRefEntry::getObjStreamIndex();
                  if (__range8._4_4_ < iVar2) {
                    __range8._4_4_ = QPDFXRefEntry::getObjStreamIndex();
                  }
                }
                __gnu_cxx::
                __normal_iterator<QPDFXRefEntry_*,_std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>_>
                ::operator++(&__end8);
              }
              while (__range8._4_4_ != 0) {
                __range8._4_4_ = __range8._4_4_ >> 8;
                this->xref_f2_nbytes = this->xref_f2_nbytes + 1;
              }
              length = this->xref_f1_nbytes + 1 + this->xref_f2_nbytes;
              sVar3 = std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>::size(&this->xref);
              this->xref_size = sVar3 + 1;
              local_178 = this->xref_size * length;
              poVar7 = std::operator<<(this->out,"  /Length ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_178);
              poVar7 = std::operator<<(poVar7,"\n");
              poVar7 = std::operator<<(poVar7,"  /W [ 1 ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->xref_f1_nbytes);
              poVar7 = std::operator<<(poVar7," ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->xref_f2_nbytes);
              std::operator<<(poVar7," ]\n");
              this->state = st_in_xref_stream_dict;
            }
          }
          else {
            this->state = st_in_ostream_dict;
            this->ostream_id = this->last_obj;
          }
        }
      }
    }
    else if (this->state == st_in_ostream_dict) {
      local_188 = sv("stream\n",7);
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str,
                         local_188);
      if (iVar2 == 0) {
        this->state = st_in_ostream_offsets;
      }
      else {
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::push_back(&this->ostream_discarded,(value_type *)&input_view._M_str);
        bVar1 = processLines::anon_class_24_3_b7c57803::operator()
                          ((anon_class_24_3_b7c57803 *)local_98,
                           &processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_);
        if (bVar1) {
          pvVar5 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)&matches.len_line,1);
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str(&local_1a8,pvVar5);
          std::__cxx11::string::operator=((string *)&this->ostream_extends,(string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
        }
      }
    }
    else if (this->state == st_in_ostream_offsets) {
      bVar1 = processLines::anon_class_24_3_b7c57803::operator()
                        ((anon_class_24_3_b7c57803 *)local_98,
                         &processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_);
      if (bVar1) {
        pvVar5 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&matches.len_line,1);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str(&local_1c8,pvVar5);
        checkObjId(this,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        this->stream_start = this->last_offset;
        this->state = st_in_ostream_outer;
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::push_back(&this->ostream,(value_type *)&input_view._M_str);
      }
      else {
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::push_back(&this->ostream_discarded,(value_type *)&input_view._M_str);
      }
    }
    else if (this->state == st_in_ostream_outer) {
      adjustOstreamXref(this);
      local_1d0 = this->last_offset - this->stream_start;
      std::vector<long_long,_std::allocator<long_long>_>::push_back
                (&this->ostream_offsets,&local_1d0);
      this->state = st_in_ostream_obj;
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::push_back(&this->ostream,(value_type *)&input_view._M_str);
    }
    else if (this->state == st_in_ostream_obj) {
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::push_back(&this->ostream,(value_type *)&input_view._M_str);
      bVar1 = processLines::anon_class_24_3_b7c57803::operator()
                        ((anon_class_24_3_b7c57803 *)local_98,
                         &processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_);
      if (bVar1) {
        pvVar5 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&matches.len_line,1);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str(&local_1f0,pvVar5);
        checkObjId(this,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        this->state = st_in_ostream_outer;
      }
      else {
        local_200 = sv("endstream\n",10);
        iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str,
                           local_200);
        if (iVar2 == 0) {
          local_208 = this->last_offset - this->stream_start;
          sVar8 = QIntC::to_size<long_long>(&local_208);
          this->stream_length = sVar8;
          writeOstream(this);
          this->state = st_in_obj;
        }
      }
    }
    else if (this->state == st_in_xref_stream_dict) {
      bVar9 = sv("/Length",7);
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str,
                         bVar9,0);
      if (sVar4 == 0xffffffffffffffff) {
        bVar9 = sv("/W",2);
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str,
                           bVar9,0);
        if (sVar4 == 0xffffffffffffffff) {
          bVar9 = sv("/Size",5);
          sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str,
                             bVar9,0);
          if (sVar4 == 0xffffffffffffffff) {
            __str_02._M_str = (char *)line._M_len;
            __str_02._M_len = (size_t)input_view._M_str;
            std::operator<<(this->out,__str_02);
          }
          else {
            sVar3 = std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>::size(&this->xref);
            poVar7 = std::operator<<(this->out,"  /Size ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar3 + 1);
            std::operator<<(poVar7,"\n");
          }
        }
      }
      bVar9 = sv("stream\n",7);
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str,
                         bVar9);
      if (iVar2 == 0) {
        writeBinary(this,0,1);
        writeBinary(this,0,this->xref_f1_nbytes);
        writeBinary(this,0,this->xref_f2_nbytes);
        __end10 = std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>::begin(&this->xref);
        x = (QPDFXRefEntry *)
            std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>::end(&this->xref);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end10,(__normal_iterator<QPDFXRefEntry_*,_std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>_>
                                       *)&x);
          if (!bVar1) break;
          f1 = (unsigned_long_long)
               __gnu_cxx::
               __normal_iterator<QPDFXRefEntry_*,_std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>_>
               ::operator*(&__end10);
          f2 = 0;
          uStack_298 = 0;
          local_2a0 = QPDFXRefEntry::getType();
          local_29c = QIntC::to_uint<int>(&local_2a0);
          if (local_29c == 1) {
            local_2a8 = QPDFXRefEntry::getOffset();
            f2 = QIntC::to_ulonglong<long_long>(&local_2a8);
          }
          else {
            local_2ac = QPDFXRefEntry::getObjStreamNumber();
            f2 = QIntC::to_ulonglong<int>(&local_2ac);
            local_2b0 = QPDFXRefEntry::getObjStreamIndex();
            uStack_298 = QIntC::to_ulonglong<int>(&local_2b0);
          }
          writeBinary(this,(ulong)local_29c,1);
          writeBinary(this,f2,this->xref_f1_nbytes);
          writeBinary(this,uStack_298,this->xref_f2_nbytes);
          __gnu_cxx::
          __normal_iterator<QPDFXRefEntry_*,_std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>_>
          ::operator++(&__end10);
        }
        poVar7 = std::operator<<(this->out,"\nendstream\nendobj\n\n");
        poVar7 = std::operator<<(poVar7,"startxref\n");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->xref_offset);
        std::operator<<(poVar7,"\n%%EOF\n");
        this->state = st_done;
      }
    }
    else if (this->state == st_in_stream) {
      local_2c0 = sv("endstream\n",10);
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str,
                         local_2c0);
      if (iVar2 == 0) {
        local_2c8 = this->last_offset - this->stream_start;
        sVar8 = QIntC::to_size<long_long>(&local_2c8);
        this->stream_length = sVar8;
        this->state = st_after_stream;
      }
      local_2d8 = input_view._M_str;
      sStack_2d0 = line._M_len;
      __str_01._M_str = (char *)line._M_len;
      __str_01._M_len = (size_t)input_view._M_str;
      std::operator<<(this->out,__str_01);
    }
    else if (this->state == st_after_stream) {
      local_2e8 = sv("%QDF: ignore_newline\n",0x15);
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str,
                         local_2e8);
      if (iVar2 == 0) {
        if (this->stream_length != 0) {
          this->stream_length = this->stream_length - 1;
        }
      }
      else {
        bVar1 = processLines::anon_class_24_3_b7c57803::operator()
                          ((anon_class_24_3_b7c57803 *)local_98,
                           &processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_);
        if (bVar1) {
          pvVar5 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)&matches.len_line,1);
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str(&local_308,pvVar5);
          checkObjId(this,&local_308);
          std::__cxx11::string::~string((string *)&local_308);
          this->state = st_in_length;
        }
      }
      local_318 = input_view._M_str;
      sStack_310 = line._M_len;
      __str_00._M_str = (char *)line._M_len;
      __str_00._M_len = (size_t)input_view._M_str;
      std::operator<<(this->out,__str_00);
    }
    else if (this->state == st_in_length) {
      bVar1 = processLines::anon_class_24_3_b7c57803::operator()
                        ((anon_class_24_3_b7c57803 *)local_98,
                         &processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_);
      if (!bVar1) {
        std::operator+(&local_378,&this->filename,":");
        std::__cxx11::to_string((string *)((long)&new_length.field_2 + 8),this->lineno);
        std::operator+(&local_358,&local_378,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&new_length.field_2 + 8));
        std::operator+(&local_338,&local_358,": expected integer");
        fatal(this,&local_338);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)(new_length.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_378);
      }
      std::__cxx11::to_string(&local_3d8,this->stream_length);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8,
                     &local_3d8,"\n");
      std::__cxx11::string::~string((string *)&local_3d8);
      local_3e0 = std::basic_string_view<char,_std::char_traits<char>_>::length
                            ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str)
      ;
      qVar6 = QIntC::to_offset<unsigned_long>(&local_3e0);
      this->offset = this->offset - qVar6;
      n = std::__cxx11::string::length();
      qVar6 = QIntC::to_offset<unsigned_long>(&n);
      this->offset = this->offset + qVar6;
      std::operator<<(this->out,(string *)local_3b8);
      this->state = st_top;
      std::__cxx11::string::~string((string *)local_3b8);
    }
    else if (this->state == st_at_xref) {
      sVar3 = std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>::size(&this->xref);
      poVar7 = std::operator<<(this->out,"0 ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar3 + 1);
      std::operator<<(poVar7,"\n0000000000 65535 f \n");
      __end13 = std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>::begin(&this->xref);
      e_1 = (QPDFXRefEntry *)
            std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>::end(&this->xref);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end13,(__normal_iterator<QPDFXRefEntry_*,_std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>_>
                                     *)&e_1);
        if (!bVar1) break;
        local_410 = __gnu_cxx::
                    __normal_iterator<QPDFXRefEntry_*,_std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>_>
                    ::operator*(&__end13);
        poVar7 = this->out;
        iVar2 = QPDFXRefEntry::getOffset();
        QUtil::int_to_string_abi_cxx11_((longlong)local_430,iVar2);
        poVar7 = std::operator<<(poVar7,local_430);
        std::operator<<(poVar7," 00000 n \n");
        std::__cxx11::string::~string(local_430);
        __gnu_cxx::
        __normal_iterator<QPDFXRefEntry_*,_std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>_>
        ::operator++(&__end13);
      }
      this->state = st_before_trailer;
    }
    else if (this->state == st_before_trailer) {
      bVar9 = sv("trailer <<\n",0xb);
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str,
                         bVar9);
      if (iVar2 == 0) {
        __str._M_str = (char *)line._M_len;
        __str._M_len = (size_t)input_view._M_str;
        std::operator<<(this->out,__str);
        this->state = st_in_trailer;
      }
    }
    else if (this->state == st_in_trailer) {
      bVar1 = processLines::anon_class_24_3_b7c57803::operator()
                        ((anon_class_24_3_b7c57803 *)local_98,
                         &processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_);
      if (bVar1) {
        poVar7 = std::operator<<(this->out,"  /Size ");
        sVar3 = std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>::size(&this->xref);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar3 + 1);
        std::operator<<(poVar7,"\n");
      }
      else {
        bVar9._M_str = (char *)line._M_len;
        bVar9._M_len = (size_t)input_view._M_str;
        std::operator<<(this->out,bVar9);
      }
      bVar9 = sv(">>\n",3);
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&input_view._M_str,
                         bVar9);
      if (iVar2 == 0) {
        poVar7 = std::operator<<(this->out,"startxref\n");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->xref_offset);
        std::operator<<(poVar7,"\n%%EOF\n");
        this->state = st_done;
      }
    }
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&matches.len_line);
  return;
}

Assistant:

void
QdfFixer::processLines(std::string const& input)
{
    using namespace std::literals;

    static const std::regex re_n_0_obj("^(\\d+) 0 obj\n$");
    static const std::regex re_extends("/Extends (\\d+ 0 R)");
    static const std::regex re_ostream_obj("^%% Object stream: object (\\d+)");
    static const std::regex re_num("^\\d+\n$");
    static const std::regex re_size_n("^  /Size \\d+\n$");

    auto sv_diff = [](size_t i) { return static_cast<std::string_view::difference_type>(i); };

    lineno = 0;
    bool more = true;
    auto len_line = sv_diff(0);

    std::string_view line;
    std::string_view input_view{input.data(), input.size()};
    size_t offs = 0;

    auto b_line = input.cbegin();
    std::smatch m;
    auto const matches = [&m, &b_line, &len_line](std::regex const& r) {
        return std::regex_search(b_line, b_line + len_line, m, r);
    };

    while (more) {
        ++lineno;
        last_offset = offset;
        b_line += len_line;

        offs = input_view.find('\n');
        if (offs == std::string::npos) {
            more = false;
            line = input_view;
        } else {
            offs++;
            line = input_view.substr(0, offs);
            input_view.remove_prefix(offs);
        }
        len_line = sv_diff(line.size());
        offset += len_line;

        if (state == st_top) {
            if (matches(re_n_0_obj)) {
                checkObjId(m[1].str());
                state = st_in_obj;
            } else if (line.compare("xref\n"sv) == 0) {
                xref_offset = last_offset;
                state = st_at_xref;
            }
            out << line;
        } else if (state == st_in_obj) {
            out << line;
            if (line.compare("stream\n"sv) == 0) {
                state = st_in_stream;
                stream_start = offset;
            } else if (line.compare("endobj\n"sv) == 0) {
                state = st_top;
            } else if (line.find("/Type /ObjStm"sv) != line.npos) {
                state = st_in_ostream_dict;
                ostream_id = last_obj;
            } else if (line.find("/Type /XRef"sv) != line.npos) {
                xref_offset = xref.back().getOffset();
                xref_f1_nbytes = 0;
                auto t = xref_offset;
                while (t) {
                    t >>= 8;
                    ++xref_f1_nbytes;
                }
                // Figure out how many bytes we need for ostream
                // index. Make sure we get at least 1 byte even if
                // there are no object streams.
                int max_objects = 1;
                for (auto const& e: xref) {
                    if ((e.getType() == 2) && (e.getObjStreamIndex() > max_objects)) {
                        max_objects = e.getObjStreamIndex();
                    }
                }
                while (max_objects) {
                    max_objects >>= 8;
                    ++xref_f2_nbytes;
                }
                auto esize = 1 + xref_f1_nbytes + xref_f2_nbytes;
                xref_size = 1 + xref.size();
                auto length = xref_size * esize;
                out << "  /Length " << length << "\n"
                    << "  /W [ 1 " << xref_f1_nbytes << " " << xref_f2_nbytes << " ]\n";
                state = st_in_xref_stream_dict;
            }
        } else if (state == st_in_ostream_dict) {
            if (line.compare("stream\n"sv) == 0) {
                state = st_in_ostream_offsets;
            } else {
                ostream_discarded.push_back(line);
                if (matches(re_extends)) {
                    ostream_extends = m[1].str();
                }
            }
            // discard line
        } else if (state == st_in_ostream_offsets) {
            if (matches(re_ostream_obj)) {
                checkObjId(m[1].str());
                stream_start = last_offset;
                state = st_in_ostream_outer;
                ostream.push_back(line);
            } else {
                ostream_discarded.push_back(line);
            }
            // discard line
        } else if (state == st_in_ostream_outer) {
            adjustOstreamXref();
            ostream_offsets.push_back(last_offset - stream_start);
            state = st_in_ostream_obj;
            ostream.push_back(line);
        } else if (state == st_in_ostream_obj) {
            ostream.push_back(line);
            if (matches(re_ostream_obj)) {
                checkObjId(m[1].str());
                state = st_in_ostream_outer;
            } else if (line.compare("endstream\n"sv) == 0) {
                stream_length = QIntC::to_size(last_offset - stream_start);
                writeOstream();
                state = st_in_obj;
            }
        } else if (state == st_in_xref_stream_dict) {
            if ((line.find("/Length"sv) != line.npos) || (line.find("/W"sv) != line.npos)) {
                // already printed
            } else if (line.find("/Size"sv) != line.npos) {
                auto size = 1 + xref.size();
                out << "  /Size " << size << "\n";
            } else {
                out << line;
            }
            if (line.compare("stream\n"sv) == 0) {
                writeBinary(0, 1);
                writeBinary(0, xref_f1_nbytes);
                writeBinary(0, xref_f2_nbytes);
                for (auto const& x: xref) {
                    unsigned long long f1 = 0;
                    unsigned long long f2 = 0;
                    unsigned int type = QIntC::to_uint(x.getType());
                    if (1 == type) {
                        f1 = QIntC::to_ulonglong(x.getOffset());
                    } else {
                        f1 = QIntC::to_ulonglong(x.getObjStreamNumber());
                        f2 = QIntC::to_ulonglong(x.getObjStreamIndex());
                    }
                    writeBinary(type, 1);
                    writeBinary(f1, xref_f1_nbytes);
                    writeBinary(f2, xref_f2_nbytes);
                }
                out << "\nendstream\nendobj\n\n"
                    << "startxref\n"
                    << xref_offset << "\n%%EOF\n";
                state = st_done;
            }
        } else if (state == st_in_stream) {
            if (line.compare("endstream\n"sv) == 0) {
                stream_length = QIntC::to_size(last_offset - stream_start);
                state = st_after_stream;
            }
            out << line;
        } else if (state == st_after_stream) {
            if (line.compare("%QDF: ignore_newline\n"sv) == 0) {
                if (stream_length > 0) {
                    --stream_length;
                }
            } else if (matches(re_n_0_obj)) {
                checkObjId(m[1].str());
                state = st_in_length;
            }
            out << line;
        } else if (state == st_in_length) {
            if (!matches(re_num)) {
                fatal(filename + ":" + std::to_string(lineno) + ": expected integer");
            }
            std::string new_length = std::to_string(stream_length) + "\n";
            offset -= QIntC::to_offset(line.length());
            offset += QIntC::to_offset(new_length.length());
            out << new_length;
            state = st_top;
        } else if (state == st_at_xref) {
            auto n = xref.size();
            out << "0 " << 1 + n << "\n0000000000 65535 f \n";
            for (auto const& e: xref) {
                out << QUtil::int_to_string(e.getOffset(), 10) << " 00000 n \n";
            }
            state = st_before_trailer;
        } else if (state == st_before_trailer) {
            if (line.compare("trailer <<\n"sv) == 0) {
                out << line;
                state = st_in_trailer;
            }
            // no output
        } else if (state == st_in_trailer) {
            if (matches(re_size_n)) {
                out << "  /Size " << 1 + xref.size() << "\n";
            } else {
                out << line;
            }
            if (line.compare(">>\n"sv) == 0) {
                out << "startxref\n" << xref_offset << "\n%%EOF\n";
                state = st_done;
            }
        } else if (state == st_done) {
            // ignore
        }
    }
}